

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CBlockUndo *
GetUndoChecked(CBlockUndo *__return_storage_ptr__,BlockManager *blockman,CBlockIndex *blockindex)

{
  long lVar1;
  bool bVar2;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  allocator<char> local_49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (blockindex->nHeight != 0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock34,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x295,false);
    CheckBlockDataAvailability(blockman,blockindex,true);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock34.super_unique_lock);
    bVar2 = node::BlockManager::UndoReadFromDisk(blockman,__return_storage_ptr__,blockindex);
    if (!bVar2) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock34,"Can\'t read undo data from disk",&local_49);
      JSONRPCError(__return_storage_ptr___00,-1,(string *)&criticalblock34);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00289787;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_00289787:
  __stack_chk_fail();
}

Assistant:

static CBlockUndo GetUndoChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlockUndo blockUndo;

    // The Genesis block does not have undo data
    if (blockindex.nHeight == 0) return blockUndo;

    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/true);
    }

    if (!blockman.UndoReadFromDisk(blockUndo, blockindex)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Can't read undo data from disk");
    }

    return blockUndo;
}